

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O2

FormulaList * Shell::Flattening::flatten(FormulaList *fs,Connective con)

{
  byte bVar1;
  Formula *pFVar2;
  List<Kernel::Formula_*> **in_RCX;
  byte bVar3;
  FormulaList *pFVar4;
  bool bVar5;
  ConstIterator it;
  FormulaList *resLst;
  Stack<Kernel::Formula_*> res;
  Stack<Lib::List<Kernel::Formula_*>_*> toDo;
  
  if (fs == (FormulaList *)0x0) {
    return (FormulaList *)0x0;
  }
  res._capacity = 8;
  res._stack = (Formula **)Lib::alloc(0x40);
  res._end = res._stack + 8;
  toDo._capacity = 8;
  res._cursor = res._stack;
  toDo._stack = (List<Kernel::Formula_*> **)Lib::alloc(0x40);
  toDo._end = toDo._stack + 8;
  pFVar4 = fs;
  bVar3 = 0;
  toDo._cursor = toDo._stack;
LAB_0054d0ce:
  bVar1 = bVar3;
  pFVar2 = pFVar4->_head;
  if (pFVar2->_connective != con) goto LAB_0054d0f4;
  if (pFVar4->_tail != (List<Kernel::Formula_*> *)0x0) {
    Lib::Stack<Lib::List<Kernel::Formula_*>_*>::push(&toDo,pFVar4->_tail);
    pFVar2 = pFVar4->_head;
  }
  pFVar2 = pFVar2 + 1;
  bVar3 = 1;
  goto LAB_0054d12c;
LAB_0054d0f4:
  pFVar2 = flatten(pFVar2);
  bVar5 = pFVar2 != pFVar4->_head;
  Lib::Stack<Kernel::Formula_*>::push(&res,pFVar2);
  bVar3 = bVar1 | bVar5;
  pFVar4 = pFVar4->_tail;
  if (pFVar4 == (List<Kernel::Formula_*> *)0x0) {
    if (toDo._cursor == toDo._stack) {
      if ((bool)(bVar1 | bVar5)) {
        resLst = (FormulaList *)0x0;
        it.super_ConstRefIterator._stack = (Stack<Kernel::Formula_*> *)&resLst;
        it.super_ConstRefIterator._pointer = (Formula **)&res;
        Lib::List<Kernel::Formula*>::pushFromIterator<Lib::Stack<Kernel::Formula*>::ConstIterator>
                  ((List<Kernel::Formula*> *)res._cursor,it,in_RCX);
        fs = resLst;
      }
      Lib::Stack<Lib::List<Kernel::Formula_*>_*>::~Stack(&toDo);
      Lib::Stack<Kernel::Formula_*>::~Stack(&res);
      return fs;
    }
    pFVar2 = (Formula *)(toDo._cursor + -1);
    toDo._cursor = (List<Kernel::Formula_*> **)pFVar2;
LAB_0054d12c:
    pFVar4 = *(FormulaList **)pFVar2;
  }
  goto LAB_0054d0ce;
}

Assistant:

FormulaList* Flattening::flatten (FormulaList* fs, 
				  Connective con)
{
  ASS(con == OR || con == AND);

#if 1
  if(!fs) {
    return 0;
  }

  FormulaList* fs0 = fs;

  bool modified = false;
  Stack<Formula*> res(8);
  Stack<FormulaList*> toDo(8);
  for(;;) {
    if(fs->head()->connective()==con) {
      modified = true;
      if(fs->tail()) {
	toDo.push(fs->tail());
      }
      fs = fs->head()->args();
      continue;
    }
    Formula* hdRes = flatten(fs->head());
    if(hdRes!=fs->head()) {
      modified = true;
    }
    res.push(hdRes);
    fs = fs->tail();
    if(!fs) {
      if(toDo.isEmpty()) {
	break;
      }
      fs = toDo.pop();
    }
  }
  if(!modified) {
    return fs0;
  }
  FormulaList* resLst = 0;
  FormulaList::pushFromIterator(Stack<Formula*>::TopFirstIterator(res), resLst);
  return resLst;
#else
  if (fs->isEmpty()) {
    return fs;
  }
  Formula* head = flatten(fs->head());
  FormulaList* tail = flatten(fs->tail(),con);

  if (head->connective() == con) {
    return FormulaList::append(head->args(), tail);
  }

  if (head == fs->head() && tail == fs->tail()) {
    return fs;
  }
  return new FormulaList(head,tail);
#endif
}